

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O0

void startElementNsDebug(void *ctx,xmlChar *localname,xmlChar *prefix,xmlChar *URI,int nb_namespaces
                        ,xmlChar **namespaces,int nb_attributes,int nb_defaulted,
                        xmlChar **attributes)

{
  int local_3c;
  int i;
  xmlChar **namespaces_local;
  int nb_namespaces_local;
  xmlChar *URI_local;
  xmlChar *prefix_local;
  xmlChar *localname_local;
  void *ctx_local;
  
  callbacks = callbacks + 1;
  if (noout == 0) {
    fprintf(_stdout,"SAX.startElementNs(%s",localname);
    if (prefix == (xmlChar *)0x0) {
      fprintf(_stdout,", NULL");
    }
    else {
      fprintf(_stdout,", %s",prefix);
    }
    if (URI == (xmlChar *)0x0) {
      fprintf(_stdout,", NULL");
    }
    else {
      fprintf(_stdout,", \'%s\'",URI);
    }
    fprintf(_stdout,", %d",(ulong)(uint)nb_namespaces);
    if (namespaces != (xmlChar **)0x0) {
      for (local_3c = 0; SBORROW4(local_3c,nb_namespaces * 2) != local_3c + nb_namespaces * -2 < 0;
          local_3c = local_3c + 2) {
        fprintf(_stdout,", xmlns");
        if (namespaces[local_3c] != (xmlChar *)0x0) {
          fprintf(_stdout,":%s",namespaces[local_3c]);
        }
        fprintf(_stdout,"=\'%s\'",namespaces[local_3c + 1]);
      }
    }
    fprintf(_stdout,", %d, %d",(ulong)(uint)nb_attributes,(ulong)(uint)nb_defaulted);
    if (attributes != (xmlChar **)0x0) {
      for (local_3c = 0; SBORROW4(local_3c,nb_attributes * 5) != local_3c + nb_attributes * -5 < 0;
          local_3c = local_3c + 5) {
        if (attributes[local_3c + 1] == (xmlChar *)0x0) {
          fprintf(_stdout,", %s=\'",attributes[local_3c]);
        }
        else {
          fprintf(_stdout,", %s:%s=\'",attributes[local_3c + 1],attributes[local_3c]);
        }
        fprintf(_stdout,"%.4s...\', %d",attributes[local_3c + 3],
                (ulong)(uint)((int)attributes[local_3c + 4] - (int)attributes[local_3c + 3]));
      }
    }
    fprintf(_stdout,")\n");
  }
  return;
}

Assistant:

static void
startElementNsDebug(void *ctx ATTRIBUTE_UNUSED,
                    const xmlChar *localname,
                    const xmlChar *prefix,
                    const xmlChar *URI,
		    int nb_namespaces,
		    const xmlChar **namespaces,
		    int nb_attributes,
		    int nb_defaulted,
		    const xmlChar **attributes)
{
    int i;

    callbacks++;
    if (noout)
	return;
    fprintf(stdout, "SAX.startElementNs(%s", (char *) localname);
    if (prefix == NULL)
	fprintf(stdout, ", NULL");
    else
	fprintf(stdout, ", %s", (char *) prefix);
    if (URI == NULL)
	fprintf(stdout, ", NULL");
    else
	fprintf(stdout, ", '%s'", (char *) URI);
    fprintf(stdout, ", %d", nb_namespaces);

    if (namespaces != NULL) {
        for (i = 0;i < nb_namespaces * 2;i++) {
	    fprintf(stdout, ", xmlns");
	    if (namespaces[i] != NULL)
	        fprintf(stdout, ":%s", namespaces[i]);
	    i++;
	    fprintf(stdout, "='%s'", namespaces[i]);
	}
    }
    fprintf(stdout, ", %d, %d", nb_attributes, nb_defaulted);
    if (attributes != NULL) {
        for (i = 0;i < nb_attributes * 5;i += 5) {
	    if (attributes[i + 1] != NULL)
		fprintf(stdout, ", %s:%s='", attributes[i + 1], attributes[i]);
	    else
		fprintf(stdout, ", %s='", attributes[i]);
	    fprintf(stdout, "%.4s...', %d", attributes[i + 3],
		    (int)(attributes[i + 4] - attributes[i + 3]));
	}
    }
    fprintf(stdout, ")\n");
}